

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics_accumulation.cc
# Opt level: O0

bool __thiscall
sptk::StatisticsAccumulation::GetSum
          (StatisticsAccumulation *this,Buffer *buffer,vector<double,_std::allocator<double>_> *sum)

{
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> __first;
  size_type sVar1;
  const_iterator __result;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RDI;
  int n;
  undefined8 in_stack_ffffffffffffff90;
  anon_class_4_1_54a3980e __unary_op;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff98;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffffa0;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffffa8;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  bool local_1;
  
  __unary_op.n = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  if (((((ulong)(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage & 0x10000) == 0) ||
      (*(int *)((long)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_finish + 4) < 1)) ||
     (in_RDX == (vector<double,_std::allocator<double>_> *)0x0)) {
    local_1 = false;
  }
  else {
    sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RDX);
    if (sVar1 != (long)(*(int *)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>).
                                 _M_impl.super__Vector_impl_data._M_finish + 1)) {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffffb0._M_current,
                 (size_type)in_stack_ffffffffffffffa8._M_current);
    }
    if (((ulong)(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage & 0x100) == 0) {
      __result = std::vector<double,_std::allocator<double>_>::begin(in_RDI);
      std::vector<double,_std::allocator<double>_>::end(in_RDI);
      std::vector<double,_std::allocator<double>_>::begin(in_RDI);
      __first._M_current._4_4_ = in_stack_ffffffffffffffbc;
      __first._M_current._0_4_ = in_stack_ffffffffffffffb8;
      std::
      copy<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                (__first,in_stack_ffffffffffffffb0,
                 (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                 __result._M_current);
    }
    else {
      std::vector<double,_std::allocator<double>_>::begin(in_RDI);
      std::vector<double,_std::allocator<double>_>::end(in_RDI);
      std::vector<double,_std::allocator<double>_>::begin(in_RDI);
      std::
      transform<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,sptk::StatisticsAccumulation::GetSum(sptk::StatisticsAccumulation::Buffer_const&,std::vector<double,std::allocator<double>>*)const::__0>
                (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                 __unary_op);
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool StatisticsAccumulation::GetSum(
    const StatisticsAccumulation::Buffer& buffer,
    std::vector<double>* sum) const {
  if (!is_valid_ || num_statistics_order_ < 1 || NULL == sum) {
    return false;
  }

  if (sum->size() != static_cast<std::size_t>(num_order_ + 1)) {
    sum->resize(num_order_ + 1);
  }

  if (numerically_stable_) {
    const int n(buffer.zeroth_order_statistics_);
    std::transform(buffer.first_order_statistics_.begin(),
                   buffer.first_order_statistics_.end(), sum->begin(),
                   [n](double x) { return n * x; });
  } else {
    std::copy(buffer.first_order_statistics_.begin(),
              buffer.first_order_statistics_.end(), sum->begin());
  }

  return true;
}